

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  size_t sVar1;
  int iVar2;
  size_t n;
  size_t *psVar3;
  mbedtls_mpi_uint **ppmVar4;
  mbedtls_mpi TB;
  
  iVar2 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar2 < 0) {
    return -10;
  }
  psVar3 = &TB.n;
  TB.s = 1;
  TB.n = 0;
  TB.p = (mbedtls_mpi_uint *)0x0;
  if (X == B) {
    iVar2 = mbedtls_mpi_copy(&TB,B);
    if (iVar2 != 0) goto LAB_00126245;
    ppmVar4 = &TB.p;
  }
  else {
    ppmVar4 = &B->p;
    psVar3 = &B->n;
  }
  if ((X == A) || (iVar2 = mbedtls_mpi_copy(X,A), iVar2 == 0)) {
    X->s = 1;
    sVar1 = *psVar3;
    do {
      n = sVar1;
      if (n == 0) break;
      sVar1 = n - 1;
    } while ((*ppmVar4)[n - 1] == 0);
    mpi_sub_hlp(n,*ppmVar4,X->p);
    iVar2 = 0;
  }
LAB_00126245:
  mbedtls_mpi_free(&TB);
  return iVar2;
}

Assistant:

int mbedtls_mpi_sub_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    mbedtls_mpi TB;
    int ret;
    size_t n;

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    mbedtls_mpi_init( &TB );

    if( X == B )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) );
        B = &TB;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned subtractions.
     */
    X->s = 1;

    ret = 0;

    for( n = B->n; n > 0; n-- )
        if( B->p[n - 1] != 0 )
            break;

    mpi_sub_hlp( n, B->p, X->p );

cleanup:

    mbedtls_mpi_free( &TB );

    return( ret );
}